

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

HelicsCore helicsCoreClone(HelicsCore core,HelicsError *err)

{
  CoreObject *pCVar1;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var2;
  __single_object coreClone;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_38;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_30;
  MasterObjectHolder *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pCVar1 = helics::getCoreObject(core,err);
  if (pCVar1 == (CoreObject *)0x0) {
    _Var2._M_head_impl = (CoreObject *)0x0;
  }
  else {
    _Var2._M_head_impl = (CoreObject *)operator_new(0x48);
    ((_Var2._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var2._M_head_impl)->index = 0;
    (_Var2._M_head_impl)->valid = 0;
    ((_Var2._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var2._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var2._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var2._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((_Var2._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((_Var2._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (_Var2._M_head_impl)->valid = 0x378424ec;
    ((_Var2._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pCVar1->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)_Var2._M_head_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((_Var2._M_head_impl)->coreptr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pCVar1->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    getMasterHolder();
    local_38._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (_Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)0x0;
    local_30._M_head_impl = _Var2._M_head_impl;
    MasterObjectHolder::addCore
              (local_28,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_30);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_30
              );
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_38
              );
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsCore helicsCoreClone(HelicsCore core, HelicsError* err)
{
    auto* coreObj = helics::getCoreObject(core, err);
    if (coreObj == nullptr) {
        return nullptr;
    }
    try {
        auto coreClone = std::make_unique<helics::CoreObject>();
        coreClone->valid = gCoreValidationIdentifier;
        coreClone->coreptr = coreObj->coreptr;
        auto* retcore = reinterpret_cast<HelicsCore>(coreClone.get());
        getMasterHolder()->addCore(std::move(coreClone));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}